

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

int imagetotga(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 *pOVar1;
  byte bVar2;
  opj_image_comp_t *poVar3;
  FILE *__s;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  OPJ_UINT32 OVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  uchar value;
  uchar uc0;
  OPJ_UINT16 us0;
  OPJ_UINT16 image_h;
  uchar image_type;
  OPJ_UINT16 image_w;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined2 local_7c;
  char local_79;
  float local_78;
  OPJ_UINT32 local_74;
  OPJ_UINT32 local_70;
  int local_6c;
  int local_68;
  undefined2 local_64;
  undefined1 local_62;
  undefined1 local_61;
  char *local_60;
  ulong local_58;
  OPJ_UINT32 local_4c;
  int local_48;
  float local_44;
  float local_40;
  undefined2 local_3a;
  long local_38;
  
  __s = fopen(outfile,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
  }
  else {
    uVar6 = image->numcomps;
    local_58 = (ulong)uVar6;
    poVar3 = image->comps;
    lVar5 = 0;
    do {
      if ((ulong)(uVar6 - 1) * 0x40 + 0x40 == lVar5 + 0x40) {
        local_70 = poVar3->w;
        OVar8 = poVar3->h;
        if (OVar8 == 0 || local_70 == 0) goto LAB_001090e2;
        local_79 = ((uVar6 - 2 & 0xfffffffd) == 0) * '\b' + '\x18';
        local_7d = 0;
        sVar4 = fwrite(&local_7d,1,1,__s);
        if ((sVar4 == 1) && (sVar4 = fwrite(&local_7d,1,1,__s), sVar4 == 1)) {
          local_61 = 2;
          sVar4 = fwrite(&local_61,1,1,__s);
          if (sVar4 == 1) {
            local_7c = 0;
            sVar4 = fwrite(&local_7c,2,1,__s);
            if (((sVar4 == 1) && (sVar4 = fwrite(&local_7c,2,1,__s), sVar4 == 1)) &&
               ((sVar4 = fwrite(&local_7d,1,1,__s), sVar4 == 1 &&
                ((sVar4 = fwrite(&local_7c,2,1,__s), sVar4 == 1 &&
                 (sVar4 = fwrite(&local_7c,2,1,__s), sVar4 == 1)))))) {
              local_3a = (undefined2)local_70;
              local_64 = (undefined2)OVar8;
              sVar4 = fwrite(&local_3a,2,1,__s);
              if ((sVar4 == 1) &&
                 ((sVar4 = fwrite(&local_64,2,1,__s), sVar4 == 1 &&
                  (sVar4 = fwrite(&local_79,1,1,__s), sVar4 == 1)))) {
                local_62 = 0x28;
                sVar4 = fwrite(&local_62,1,1,__s);
                if (sVar4 == 1) {
                  poVar3 = image->comps;
                  bVar2 = (byte)poVar3->prec;
                  local_48 = 1 << (bVar2 - 1 & 0x1f);
                  if (poVar3->sgnd == 0) {
                    local_48 = 0;
                  }
                  iVar9 = 0;
                  local_6c = 0;
                  local_68 = 0;
                  if (2 < image->numcomps) {
                    local_68 = 0;
                    local_6c = 0;
                    if (poVar3[1].sgnd != 0) {
                      local_6c = 1 << ((char)poVar3[1].prec - 1U & 0x1f);
                    }
                    if (poVar3[2].sgnd != 0) {
                      local_68 = 1 << ((char)poVar3[2].prec - 1U & 0x1f);
                    }
                  }
                  if (0 < (int)OVar8) {
                    local_78 = 255.0 / (float)~(-1 << (bVar2 & 0x1f));
                    local_74 = 0;
                    local_38 = (ulong)(image->numcomps - 1) << 6;
                    local_60 = outfile;
                    local_4c = OVar8;
                    do {
                      if (0 < (int)local_70) {
                        uVar6 = local_74 * local_70;
                        OVar8 = local_70;
                        do {
                          poVar3 = image->comps;
                          uVar7 = (ulong)uVar6;
                          iVar9 = poVar3->data[uVar7] + local_48;
                          local_44 = (float)iVar9;
                          fVar10 = local_44;
                          local_40 = local_44;
                          if (2 < image->numcomps) {
                            local_40 = (float)(poVar3[1].data[uVar7] + local_6c);
                            fVar10 = (float)(poVar3[2].data[uVar7] + local_68);
                          }
                          fVar11 = 255.0;
                          if ((fVar10 <= 255.0) && (fVar11 = fVar10, fVar10 < 0.0)) {
                            fVar11 = 0.0;
                          }
                          local_7e = (undefined1)(int)(fVar11 * local_78);
                          sVar4 = fwrite(&local_7e,1,1,__s);
                          if (sVar4 == 0) {
LAB_001090c5:
                            fprintf(_stderr,"failed to write 1 byte for %s\n",local_60);
                            goto LAB_001090e2;
                          }
                          fVar10 = 255.0;
                          if ((local_40 <= 255.0) && (fVar10 = local_40, local_40 < 0.0)) {
                            fVar10 = 0.0;
                          }
                          local_7e = (undefined1)(int)(fVar10 * local_78);
                          sVar4 = fwrite(&local_7e,1,1,__s);
                          if (sVar4 == 0) goto LAB_001090c5;
                          fVar10 = 255.0;
                          if ((iVar9 < 0x100) && (fVar10 = local_44, iVar9 < 0)) {
                            fVar10 = 0.0;
                          }
                          local_7e = (undefined1)(int)(fVar10 * local_78);
                          sVar4 = fwrite(&local_7e,1,1,__s);
                          if (sVar4 == 0) goto LAB_001090c5;
                          if (((int)local_58 == 4) || ((int)local_58 == 2)) {
                            iVar9 = *(int *)(*(long *)((long)&image->comps->data + local_38) +
                                            uVar7 * 4);
                            fVar10 = 255.0;
                            if (iVar9 < 0x100) {
                              if (iVar9 < 0) {
                                fVar10 = 0.0;
                              }
                              else {
                                fVar10 = (float)iVar9;
                              }
                            }
                            local_7e = (undefined1)(int)(fVar10 * local_78);
                            sVar4 = fwrite(&local_7e,1,1,__s);
                            if (sVar4 == 0) goto LAB_001090c5;
                          }
                          uVar6 = uVar6 + 1;
                          OVar8 = OVar8 - 1;
                        } while (OVar8 != 0);
                      }
                      local_74 = local_74 + 1;
                    } while (local_74 != local_4c);
                    iVar9 = 0;
                  }
                  goto LAB_001090e8;
                }
              }
            }
          }
        }
        imagetotga_cold_2();
LAB_001090e2:
        iVar9 = 1;
LAB_001090e8:
        fclose(__s);
        return iVar9;
      }
    } while ((((poVar3->dx == *(OPJ_UINT32 *)((long)&poVar3[1].dx + lVar5)) &&
              (poVar3->dy == *(OPJ_UINT32 *)((long)&poVar3[1].dy + lVar5))) &&
             (poVar3->prec == *(OPJ_UINT32 *)((long)&poVar3[1].prec + lVar5))) &&
            (pOVar1 = (OPJ_UINT32 *)((long)&poVar3[1].sgnd + lVar5), lVar5 = lVar5 + 0x40,
            poVar3->sgnd == *pOVar1));
    imagetotga_cold_1();
  }
  return 1;
}

Assistant:

int imagetotga(opj_image_t * image, const char *outfile)
{
    int width, height, bpp, x, y;
    OPJ_BOOL write_alpha;
    unsigned int i;
    int adjustR, adjustG = 0, adjustB = 0, fails;
    unsigned int alpha_channel;
    float r, g, b, a;
    unsigned char value;
    float scale;
    FILE *fdest;
    size_t res;
    fails = 1;

    fdest = fopen(outfile, "wb");
    if (!fdest) {
        fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
        return 1;
    }

    for (i = 0; i < image->numcomps - 1; i++) {
        if ((image->comps[0].dx != image->comps[i + 1].dx)
                || (image->comps[0].dy != image->comps[i + 1].dy)
                || (image->comps[0].prec != image->comps[i + 1].prec)
                || (image->comps[0].sgnd != image->comps[i + 1].sgnd)) {
            fclose(fdest);
            fprintf(stderr,
                    "Unable to create a tga file with such J2K image charateristics.\n");
            return 1;
        }
    }

    width  = (int)image->comps[0].w;
    height = (int)image->comps[0].h;

    /* Mono with alpha, or RGB with alpha. */
    write_alpha = (image->numcomps == 2) || (image->numcomps == 4);

    /* Write TGA header  */
    bpp = write_alpha ? 32 : 24;

    if (!tga_writeheader(fdest, bpp, width, height, OPJ_TRUE)) {
        goto fin;
    }

    alpha_channel = image->numcomps - 1;

    scale = 255.0f / (float)((1 << image->comps[0].prec) - 1);

    adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
    if (image->numcomps >= 3) {
        adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
        adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
    }

    for (y = 0; y < height; y++) {
        unsigned int index = (unsigned int)(y * width);

        for (x = 0; x < width; x++, index++) {
            r = (float)(image->comps[0].data[index] + adjustR);

            if (image->numcomps > 2) {
                g = (float)(image->comps[1].data[index] + adjustG);
                b = (float)(image->comps[2].data[index] + adjustB);
            } else {
                /* Greyscale ... */
                g = r;
                b = r;
            }

            /* TGA format writes BGR ... */
            if (b > 255.) {
                b = 255.;
            } else if (b < 0.) {
                b = 0.;
            }
            value = (unsigned char)(b * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (g > 255.) {
                g = 255.;
            } else if (g < 0.) {
                g = 0.;
            }
            value = (unsigned char)(g * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (r > 255.) {
                r = 255.;
            } else if (r < 0.) {
                r = 0.;
            }
            value = (unsigned char)(r * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }

            if (write_alpha) {
                a = (float)(image->comps[alpha_channel].data[index]);
                if (a > 255.) {
                    a = 255.;
                } else if (a < 0.) {
                    a = 0.;
                }
                value = (unsigned char)(a * scale);
                res = fwrite(&value, 1, 1, fdest);

                if (res < 1) {
                    fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                    goto fin;
                }
            }
        }
    }
    fails = 0;
fin:
    fclose(fdest);

    return fails;
}